

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O3

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoTriangle>::AllHigherDimensionSides
          (TPZGeoElRefLess<pzgeom::TPZGeoTriangle> *this,int side,int targetdimension,
          TPZStack<TPZGeoElSide,_10> *elsides)

{
  TPZGeoElSide *pTVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  TPZStack<int,_10> highsides;
  TPZManVector<int,_10> TStack_78;
  
  TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)&TStack_78);
  pztopology::TPZTriangle::HigherDimensionSides(side,(TPZStack<int,_10> *)&TStack_78);
  if (0 < (int)(uint)TStack_78.super_TPZVec<int>.fNElements) {
    uVar4 = 0;
    do {
      iVar3 = (**(code **)(*(long *)&this->super_TPZGeoEl + 0x208))
                        (this,TStack_78.super_TPZVec<int>.fStore[uVar4]);
      if (iVar3 == targetdimension) {
        iVar3 = TStack_78.super_TPZVec<int>.fStore[uVar4];
        (*(elsides->super_TPZManVector<TPZGeoElSide,_10>).super_TPZVec<TPZGeoElSide>._vptr_TPZVec[3]
        )(elsides,(elsides->super_TPZManVector<TPZGeoElSide,_10>).super_TPZVec<TPZGeoElSide>.
                  fNElements + 1);
        pTVar1 = (elsides->super_TPZManVector<TPZGeoElSide,_10>).super_TPZVec<TPZGeoElSide>.fStore;
        lVar2 = (elsides->super_TPZManVector<TPZGeoElSide,_10>).super_TPZVec<TPZGeoElSide>.
                fNElements;
        pTVar1[lVar2 + -1].fGeoEl = &this->super_TPZGeoEl;
        pTVar1[lVar2 + -1].fSide = iVar3;
      }
      uVar4 = uVar4 + 1;
    } while (((uint)TStack_78.super_TPZVec<int>.fNElements & 0x7fffffff) != uVar4);
  }
  TPZManVector<int,_10>::~TPZManVector(&TStack_78);
  return;
}

Assistant:

void
TPZGeoElRefLess<TGeo>::AllHigherDimensionSides(int side,int targetdimension,TPZStack<TPZGeoElSide> &elsides){
	TPZStack<int> highsides;
	TGeo::HigherDimensionSides(side,highsides);
	int i,size = highsides.NElements();
	for(i=0;i<size;i++) {
		if(SideDimension(highsides[i]) == targetdimension) {
			elsides.Push(TPZGeoElSide(this,highsides[i]));
		}
	}
}